

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackArchiveGenerator::PackageComponents(cmCPackArchiveGenerator *this,bool ignoreGroup)

{
  Compress CVar1;
  cmCPackLog *pcVar2;
  bool bVar3;
  int iVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *this_00;
  reference component;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *this_01;
  reference ppcVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *pmVar6;
  reference __rhs;
  ostream *poVar7;
  char *pcVar8;
  string *psVar9;
  string local_1fa0 [32];
  string local_1f80;
  undefined1 local_1f60 [8];
  ostringstream cmCPackLog_msg_10;
  string local_1de8 [32];
  string local_1dc8;
  undefined1 local_1da8 [8];
  ostringstream cmCPackLog_msg_9;
  undefined1 local_1c30 [8];
  cmArchiveWrite archive_2;
  undefined1 local_1b30 [8];
  ostringstream cmCPackLog_msg_8;
  undefined1 local_19b8 [8];
  cmGeneratedFileStream gf_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1710;
  undefined1 local_16f0 [8];
  string packageFileName_2;
  string local_16c8;
  cmValue local_16a8;
  string local_16a0 [8];
  string localToplevel_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *comp_2;
  iterator __end2_2;
  iterator __begin2_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range2_2;
  string local_1640;
  undefined1 local_1620 [8];
  ostringstream cmCPackLog_msg_7;
  string local_14a8 [32];
  string local_1488;
  undefined1 local_1468 [8];
  ostringstream cmCPackLog_msg_6;
  undefined1 local_12f0 [8];
  cmArchiveWrite archive_1;
  undefined1 local_11f0 [8];
  ostringstream cmCPackLog_msg_5;
  undefined1 local_1078 [8];
  cmGeneratedFileStream gf_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  undefined1 local_db0 [8];
  string packageFileName_1;
  string local_d88;
  cmValue local_d68;
  string local_d60 [8];
  string localToplevel;
  ostringstream local_d20 [8];
  ostringstream cmCPackLog_msg_4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *comp_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range2_1;
  cmCPackComponent *comp;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range3;
  string local_b48;
  undefined1 local_b28 [8];
  ostringstream cmCPackLog_msg_3;
  string local_9b0 [32];
  string local_990;
  undefined1 local_970 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_7f8 [8];
  cmArchiveWrite archive;
  string local_710 [32];
  undefined1 local_6f0 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_578 [8];
  cmGeneratedFileStream gf;
  Deduplicator deduplicator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string packageFileName;
  ostringstream local_1b8 [8];
  ostringstream cmCPackLog_msg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
  *compG;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
  *__range2;
  bool ignoreGroup_local;
  cmCPackArchiveGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  if (ignoreGroup) {
    pmVar6 = &(this->super_cmCPackGenerator).Components;
    __end2_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::begin(pmVar6);
    comp_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::end(pmVar6);
    while (bVar3 = std::operator!=(&__end2_2,(_Self *)&comp_2), bVar3) {
      localToplevel_1.field_2._8_8_ =
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
           ::operator*(&__end2_2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_16c8,"CPACK_TEMPORARY_DIRECTORY",
                 (allocator<char> *)(packageFileName_2.field_2._M_local_buf + 0xf));
      local_16a8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_16c8);
      psVar9 = cmValue::operator_cast_to_string_(&local_16a8);
      std::__cxx11::string::string(local_16a0,(string *)psVar9);
      std::__cxx11::string::~string((string *)&local_16c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(packageFileName_2.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string
                ((string *)local_16f0,(string *)&(this->super_cmCPackGenerator).toplevel);
      std::operator+(&local_1710,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     localToplevel_1.field_2._8_8_);
      std::__cxx11::string::operator+=(local_16a0,(string *)&local_1710);
      std::__cxx11::string::~string((string *)&local_1710);
      GetArchiveComponentFileName
                ((string *)&gf_2.field_0x260,this,(string *)localToplevel_1.field_2._8_8_,false);
      std::operator+(&local_1730,"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gf_2.field_0x260);
      std::__cxx11::string::operator+=((string *)local_16f0,(string *)&local_1730);
      std::__cxx11::string::~string((string *)&local_1730);
      std::__cxx11::string::~string((string *)&gf_2.field_0x260);
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_19b8,None);
      cmGeneratedFileStream::Open
                ((cmGeneratedFileStream *)local_19b8,(string *)local_16f0,false,true);
      iVar4 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])(this,local_19b8);
      if (iVar4 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b30);
        poVar7 = std::operator<<((ostream *)local_1b30,"Problem to generate Header for archive <");
        poVar7 = std::operator<<(poVar7,(string *)local_16f0);
        poVar7 = std::operator<<(poVar7,">.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x186,pcVar8);
        std::__cxx11::string::~string((string *)&archive_2.PermissionsMask);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b30);
        this_local._4_4_ = 0;
        archive.PermissionsMask.IsValueSet = true;
        archive.PermissionsMask._5_3_ = 0;
      }
      else {
        CVar1 = this->Compress;
        iVar4 = GetThreadCount(this);
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_1c30,(ostream *)local_19b8,CVar1,&this->ArchiveFormat,0,
                   iVar4);
        bVar3 = cmArchiveWrite::Open((cmArchiveWrite *)local_1c30);
        if (bVar3) {
          bVar3 = cmArchiveWrite::operator!((cmArchiveWrite *)local_1c30);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f60);
            poVar7 = std::operator<<((ostream *)local_1f60,"Problem to create archive <");
            poVar7 = std::operator<<(poVar7,(string *)local_16f0);
            poVar7 = std::operator<<(poVar7,">, ERROR = ");
            cmArchiveWrite::GetError_abi_cxx11_(&local_1f80,(cmArchiveWrite *)local_1c30);
            poVar7 = std::operator<<(poVar7,(string *)&local_1f80);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_1f80);
            pcVar2 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x186,pcVar8);
            std::__cxx11::string::~string(local_1fa0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f60);
            this_local._4_4_ = 0;
            archive.PermissionsMask.IsValueSet = true;
            archive.PermissionsMask._5_3_ = 0;
          }
          else {
            addOneComponentToArchive
                      (this,(cmArchiveWrite *)local_1c30,
                       (cmCPackComponent *)(localToplevel_1.field_2._8_8_ + 0x20),
                       (Deduplicator *)0x0);
            archive.PermissionsMask.IsValueSet = false;
            archive.PermissionsMask._5_3_ = 0;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1da8);
          poVar7 = std::operator<<((ostream *)local_1da8,"Problem to open archive <");
          poVar7 = std::operator<<(poVar7,(string *)local_16f0);
          poVar7 = std::operator<<(poVar7,">, ERROR = ");
          cmArchiveWrite::GetError_abi_cxx11_(&local_1dc8,(cmArchiveWrite *)local_1c30);
          poVar7 = std::operator<<(poVar7,(string *)&local_1dc8);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_1dc8);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x186,pcVar8);
          std::__cxx11::string::~string(local_1de8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1da8);
          this_local._4_4_ = 0;
          archive.PermissionsMask.IsValueSet = true;
          archive.PermissionsMask._5_3_ = 0;
        }
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_1c30);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_19b8);
      if (archive.PermissionsMask._4_4_ == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_16f0);
        archive.PermissionsMask.IsValueSet = false;
        archive.PermissionsMask._5_3_ = 0;
      }
      std::__cxx11::string::~string((string *)local_16f0);
      std::__cxx11::string::~string(local_16a0);
      if (archive.PermissionsMask._4_4_ != 0) {
        return this_local._4_4_;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::operator++(&__end2_2);
    }
  }
  else {
    this_00 = &(this->super_cmCPackGenerator).ComponentGroups;
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
             ::begin(this_00);
    compG = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
               ::end(this_00);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&compG), bVar3) {
      component = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
                  ::operator*(&__end2);
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar7 = std::operator<<((ostream *)local_1b8,"Packaging component group: ");
      poVar7 = std::operator<<(poVar7,(string *)component);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x14a,pcVar8);
      std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      std::__cxx11::string::string
                ((string *)&local_248,(string *)&(this->super_cmCPackGenerator).toplevel);
      std::operator+(&local_228,&local_248,"/");
      GetArchiveComponentFileName
                ((string *)&deduplicator.Files._M_h._M_single_bucket,this,&component->first,true);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &deduplicator.Files._M_h._M_single_bucket);
      std::__cxx11::string::~string((string *)&deduplicator.Files._M_h._M_single_bucket);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      Deduplicator::Deduplicator((Deduplicator *)&gf.field_0x260);
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_578,None);
      cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_578,(string *)local_208,false,true)
      ;
      iVar4 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])(this,local_578);
      if (iVar4 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f0);
        poVar7 = std::operator<<((ostream *)local_6f0,"Problem to generate Header for archive <");
        poVar7 = std::operator<<(poVar7,(string *)local_208);
        poVar7 = std::operator<<(poVar7,">.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x154,pcVar8);
        std::__cxx11::string::~string(local_710);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f0);
        this_local._4_4_ = 0;
        archive.PermissionsMask.IsValueSet = true;
        archive.PermissionsMask._5_3_ = 0;
      }
      else {
        CVar1 = this->Compress;
        iVar4 = GetThreadCount(this);
        cmArchiveWrite::cmArchiveWrite
                  ((cmArchiveWrite *)local_7f8,(ostream *)local_578,CVar1,&this->ArchiveFormat,0,
                   iVar4);
        bVar3 = cmArchiveWrite::Open((cmArchiveWrite *)local_7f8);
        if (bVar3) {
          bVar3 = cmArchiveWrite::operator!((cmArchiveWrite *)local_7f8);
          if (bVar3) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b28);
            poVar7 = std::operator<<((ostream *)local_b28,"Problem to create archive <");
            poVar7 = std::operator<<(poVar7,(string *)local_208);
            poVar7 = std::operator<<(poVar7,">, ERROR = ");
            cmArchiveWrite::GetError_abi_cxx11_(&local_b48,(cmArchiveWrite *)local_7f8);
            poVar7 = std::operator<<(poVar7,(string *)&local_b48);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_b48);
            pcVar2 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x154,pcVar8);
            std::__cxx11::string::~string((string *)&__range3);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b28);
            this_local._4_4_ = 0;
            archive.PermissionsMask.IsValueSet = true;
            archive.PermissionsMask._5_3_ = 0;
          }
          else {
            this_01 = &(component->second).Components;
            __end3 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                               (this_01);
            comp = (cmCPackComponent *)
                   std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end
                             (this_01);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<cmCPackComponent_*const_*,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                                               *)&comp), bVar3) {
              ppcVar5 = __gnu_cxx::
                        __normal_iterator<cmCPackComponent_*const_*,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                        ::operator*(&__end3);
              addOneComponentToArchive
                        (this,(cmArchiveWrite *)local_7f8,*ppcVar5,(Deduplicator *)&gf.field_0x260);
              __gnu_cxx::
              __normal_iterator<cmCPackComponent_*const_*,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
              ::operator++(&__end3);
            }
            archive.PermissionsMask.IsValueSet = false;
            archive.PermissionsMask._5_3_ = 0;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_970);
          poVar7 = std::operator<<((ostream *)local_970,"Problem to open archive <");
          poVar7 = std::operator<<(poVar7,(string *)local_208);
          poVar7 = std::operator<<(poVar7,">, ERROR = ");
          cmArchiveWrite::GetError_abi_cxx11_(&local_990,(cmArchiveWrite *)local_7f8);
          poVar7 = std::operator<<(poVar7,(string *)&local_990);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_990);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x154,pcVar8);
          std::__cxx11::string::~string(local_9b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_970);
          this_local._4_4_ = 0;
          archive.PermissionsMask.IsValueSet = true;
          archive.PermissionsMask._5_3_ = 0;
        }
        cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_7f8);
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_578);
      if (archive.PermissionsMask._4_4_ == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_208);
        archive.PermissionsMask.IsValueSet = false;
        archive.PermissionsMask._5_3_ = 0;
      }
      Deduplicator::~Deduplicator((Deduplicator *)&gf.field_0x260);
      std::__cxx11::string::~string((string *)local_208);
      if (archive.PermissionsMask._4_4_ != 0) {
        return this_local._4_4_;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
      ::operator++(&__end2);
    }
    pmVar6 = &(this->super_cmCPackGenerator).Components;
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::begin(pmVar6);
    comp_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::end(pmVar6);
    while (bVar3 = std::operator!=(&__end2_1,(_Self *)&comp_1), bVar3) {
      __rhs = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
              ::operator*(&__end2_1);
      if ((__rhs->second).Group == (cmCPackComponentGroup *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_d20);
        poVar7 = std::operator<<((ostream *)local_d20,"Component <");
        poVar7 = std::operator<<(poVar7,(string *)&__rhs->second);
        poVar7 = std::operator<<(poVar7,"> does not belong to any group, package it separately.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar2,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x167,pcVar8);
        std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream(local_d20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d88,"CPACK_TEMPORARY_DIRECTORY",
                   (allocator<char> *)(packageFileName_1.field_2._M_local_buf + 0xf));
        local_d68 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_d88);
        psVar9 = cmValue::operator_cast_to_string_(&local_d68);
        std::__cxx11::string::string(local_d60,(string *)psVar9);
        std::__cxx11::string::~string((string *)&local_d88);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(packageFileName_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string
                  ((string *)local_db0,(string *)&(this->super_cmCPackGenerator).toplevel);
        std::operator+(&local_dd0,"/",&__rhs->first);
        std::__cxx11::string::operator+=(local_d60,(string *)&local_dd0);
        std::__cxx11::string::~string((string *)&local_dd0);
        GetArchiveComponentFileName((string *)&gf_1.field_0x260,this,&__rhs->first,false);
        std::operator+(&local_df0,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gf_1.field_0x260);
        std::__cxx11::string::operator+=((string *)local_db0,(string *)&local_df0);
        std::__cxx11::string::~string((string *)&local_df0);
        std::__cxx11::string::~string((string *)&gf_1.field_0x260);
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1078,None);
        cmGeneratedFileStream::Open
                  ((cmGeneratedFileStream *)local_1078,(string *)local_db0,false,true);
        iVar4 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])(this,local_1078);
        if (iVar4 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11f0);
          poVar7 = std::operator<<((ostream *)local_11f0,"Problem to generate Header for archive <")
          ;
          poVar7 = std::operator<<(poVar7,(string *)local_db0);
          poVar7 = std::operator<<(poVar7,">.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar2,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                          ,0x171,pcVar8);
          std::__cxx11::string::~string((string *)&archive_1.PermissionsMask);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11f0);
          this_local._4_4_ = 0;
          archive.PermissionsMask.IsValueSet = true;
          archive.PermissionsMask._5_3_ = 0;
        }
        else {
          CVar1 = this->Compress;
          iVar4 = GetThreadCount(this);
          cmArchiveWrite::cmArchiveWrite
                    ((cmArchiveWrite *)local_12f0,(ostream *)local_1078,CVar1,&this->ArchiveFormat,0
                     ,iVar4);
          bVar3 = cmArchiveWrite::Open((cmArchiveWrite *)local_12f0);
          if (bVar3) {
            bVar3 = cmArchiveWrite::operator!((cmArchiveWrite *)local_12f0);
            if (bVar3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1620);
              poVar7 = std::operator<<((ostream *)local_1620,"Problem to create archive <");
              poVar7 = std::operator<<(poVar7,(string *)local_db0);
              poVar7 = std::operator<<(poVar7,">, ERROR = ");
              cmArchiveWrite::GetError_abi_cxx11_(&local_1640,(cmArchiveWrite *)local_12f0);
              poVar7 = std::operator<<(poVar7,(string *)&local_1640);
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)&local_1640);
              pcVar2 = (this->super_cmCPackGenerator).Logger;
              std::__cxx11::ostringstream::str();
              pcVar8 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar2,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                              ,0x171,pcVar8);
              std::__cxx11::string::~string((string *)&__range2_2);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1620);
              this_local._4_4_ = 0;
              archive.PermissionsMask.IsValueSet = true;
              archive.PermissionsMask._5_3_ = 0;
            }
            else {
              addOneComponentToArchive
                        (this,(cmArchiveWrite *)local_12f0,&__rhs->second,(Deduplicator *)0x0);
              archive.PermissionsMask.IsValueSet = false;
              archive.PermissionsMask._5_3_ = 0;
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1468);
            poVar7 = std::operator<<((ostream *)local_1468,"Problem to open archive <");
            poVar7 = std::operator<<(poVar7,(string *)local_db0);
            poVar7 = std::operator<<(poVar7,">, ERROR = ");
            cmArchiveWrite::GetError_abi_cxx11_(&local_1488,(cmArchiveWrite *)local_12f0);
            poVar7 = std::operator<<(poVar7,(string *)&local_1488);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_1488);
            pcVar2 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar2,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                            ,0x171,pcVar8);
            std::__cxx11::string::~string(local_14a8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1468);
            this_local._4_4_ = 0;
            archive.PermissionsMask.IsValueSet = true;
            archive.PermissionsMask._5_3_ = 0;
          }
          cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_12f0);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1078);
        if (archive.PermissionsMask._4_4_ == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&(this->super_cmCPackGenerator).packageFileNames,(value_type *)local_db0);
          archive.PermissionsMask.IsValueSet = false;
          archive.PermissionsMask._5_3_ = 0;
        }
        std::__cxx11::string::~string((string *)local_db0);
        std::__cxx11::string::~string(local_d60);
        if (archive.PermissionsMask._4_4_ != 0) {
          return this_local._4_4_;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::operator++(&__end2_1);
    }
  }
  return 1;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponents(bool ignoreGroup)
{
  this->packageFileNames.clear();
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      // Begin the archive for this group
      std::string packageFileName = std::string(this->toplevel) + "/" +
        this->GetArchiveComponentFileName(compG.first, true);

      Deduplicator deduplicator;

      // open a block in order to automatically close archive
      // at the end of the block
      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // now iterate over the component of this group
        for (cmCPackComponent* comp : (compG.second).Components) {
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, comp, &deduplicator);
        }
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
    // Handle Orphan components (components not belonging to any groups)
    for (auto& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        std::string localToplevel(
          this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
        std::string packageFileName = std::string(this->toplevel);

        localToplevel += "/" + comp.first;
        packageFileName +=
          "/" + this->GetArchiveComponentFileName(comp.first, false);

        {
          DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
          // Add the files of this component to the archive
          this->addOneComponentToArchive(archive, &(comp.second), nullptr);
        }
        // add the generated package to package file names list
        this->packageFileNames.push_back(std::move(packageFileName));
      }
    }
  }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else {
    for (auto& comp : this->Components) {
      std::string localToplevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));
      std::string packageFileName = std::string(this->toplevel);

      localToplevel += "/" + comp.first;
      packageFileName +=
        "/" + this->GetArchiveComponentFileName(comp.first, false);

      {
        DECLARE_AND_OPEN_ARCHIVE(packageFileName, archive);
        // Add the files of this component to the archive
        this->addOneComponentToArchive(archive, &(comp.second), nullptr);
      }
      // add the generated package to package file names list
      this->packageFileNames.push_back(std::move(packageFileName));
    }
  }
  return 1;
}